

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FindOperation.cpp
# Opt level: O1

CK_ULONG __thiscall
FindOperation::retrieveHandles(FindOperation *this,CK_OBJECT_HANDLE_PTR phObject,CK_ULONG ulCount)

{
  _Rb_tree_node_base *p_Var1;
  ulong uVar2;
  _Rb_tree_header *p_Var3;
  
  p_Var1 = (this->_handles)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var3 = &(this->_handles)._M_t._M_impl.super__Rb_tree_header;
  if (ulCount == 0 || (_Rb_tree_header *)p_Var1 == p_Var3) {
    uVar2 = 0;
  }
  else {
    uVar2 = 0;
    do {
      phObject[uVar2] = *(CK_OBJECT_HANDLE *)(p_Var1 + 1);
      uVar2 = uVar2 + 1;
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1);
      if ((_Rb_tree_header *)p_Var1 == p_Var3) {
        return uVar2;
      }
    } while (uVar2 < ulCount);
  }
  return uVar2;
}

Assistant:

CK_ULONG FindOperation::retrieveHandles(CK_OBJECT_HANDLE_PTR phObject, CK_ULONG ulCount)
{
    CK_ULONG ulReturn = 0;
    std::set<CK_OBJECT_HANDLE>::const_iterator it;
    for (it=_handles.begin(); it != _handles.end(); ++it) {
        if (ulReturn >= ulCount) break;

        phObject[ulReturn++] = *it;
    }
    return ulReturn;
}